

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-agg.cpp
# Opt level: O1

bool __thiscall RasterizerAGG::addPoly(RasterizerAGG *this,Point *poly,size_t count)

{
  AGGRasterizer *this_00;
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  if (count != 0) {
    this_00 = &this->_rasterizer;
    agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::move_to_d
              (this_00,poly->x,poly->y);
    if (count != 1) {
      lVar2 = count - 1;
      pdVar1 = &poly[1].y;
      do {
        dVar5 = ((Point *)(pdVar1 + -1))->x * 256.0;
        uVar3 = -(ulong)(dVar5 < 0.0);
        uVar4 = -(ulong)(*pdVar1 * 256.0 < 0.0);
        agg::rasterizer_sl_clip<agg::ras_conv_int>::line_to<agg::rasterizer_cells_aa<agg::cell_aa>>
                  (&(this->_rasterizer).m_clipper,&this_00->m_outline,
                   (int)((double)(~uVar3 & 0x3fe0000000000000 | uVar3 & 0xbfe0000000000000) + dVar5)
                   ,(int)((double)(~uVar4 & 0x3fe0000000000000 | uVar4 & 0xbfe0000000000000) +
                         *pdVar1 * 256.0));
        (this->_rasterizer).m_status = 2;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    if ((this->_rasterizer).m_status == 2) {
      agg::rasterizer_sl_clip<agg::ras_conv_int>::line_to<agg::rasterizer_cells_aa<agg::cell_aa>>
                (&(this->_rasterizer).m_clipper,&this_00->m_outline,(this->_rasterizer).m_start_x,
                 (this->_rasterizer).m_start_y);
      (this->_rasterizer).m_status = 3;
    }
  }
  return true;
}

Assistant:

bool RasterizerAGG::addPoly(const Point* poly, size_t count) noexcept {
  if (!count)
    return true;

  _rasterizer.move_to_d(poly[0].x, poly[0].y);
  for (size_t i = 1; i < count; i++)
    _rasterizer.line_to_d(poly[i].x, poly[i].y);
  _rasterizer.close_polygon();

  return true;
}